

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O3

void __thiscall tcmalloc::ThreadCache::ListTooLong(ThreadCache *this,FreeList *list,uint32_t cl)

{
  int N;
  uint uVar1;
  uint uVar2;
  
  this->size_ = this->size_ + list->size_;
  N = (&DAT_00163304)[cl];
  ReleaseToCentralCache(this,list,cl,N);
  uVar1 = list->max_length_;
  if ((ulong)uVar1 < (ulong)(long)N) {
    list->max_length_ = uVar1 + 1;
  }
  else if (((ulong)(long)N < (ulong)uVar1) &&
          (uVar2 = list->length_overages_ + 1, list->length_overages_ = uVar2, 3 < uVar2)) {
    list->max_length_ = uVar1 - N;
    list->length_overages_ = 0;
  }
  if (this->size_ <= this->max_size_) {
    return;
  }
  Scavenge(this);
  return;
}

Assistant:

void ThreadCache::ListTooLong(FreeList* list, uint32_t cl) {
  size_ += list->object_size();

  const int batch_size = Static::sizemap()->num_objects_to_move(cl);
  ReleaseToCentralCache(list, cl, batch_size);

  // If the list is too long, we need to transfer some number of
  // objects to the central cache.  Ideally, we would transfer
  // num_objects_to_move, so the code below tries to make max_length
  // converge on num_objects_to_move.

  if (list->max_length() < batch_size) {
    // Slow start the max_length so we don't overreserve.
    list->set_max_length(list->max_length() + 1);
  } else if (list->max_length() > batch_size) {
    // If we consistently go over max_length, shrink max_length.  If we don't
    // shrink it, some amount of memory will always stay in this freelist.
    list->set_length_overages(list->length_overages() + 1);
    if (list->length_overages() > kMaxOverages) {
      ASSERT(list->max_length() > batch_size);
      list->set_max_length(list->max_length() - batch_size);
      list->set_length_overages(0);
    }
  }

  if (PREDICT_FALSE(size_ > max_size_)) {
    Scavenge();
  }
}